

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moc_toolbar.cpp
# Opt level: O3

void QtMWidgets::ToolButton::qt_static_metacall(QObject *_o,Call _c,int _id,void **_a)

{
  QSize QVar1;
  QSize *pQVar2;
  void *local_18;
  void *local_10;
  
  switch(_c) {
  case InvokeMetaMethod:
    if (_id == 1) {
      pQVar2 = (QSize *)_a[1];
LAB_0014fe61:
      setIconSize((ToolButton *)_o,pQVar2);
      return;
    }
    if (_id == 0) {
      local_10 = _a[1];
      local_18 = (void *)0x0;
      QMetaObject::activate(_o,&staticMetaObject,0,&local_18);
    }
    break;
  case ReadProperty:
    if (_id == 0) {
      pQVar2 = (QSize *)*_a;
      QVar1 = iconSize((ToolButton *)_o);
      *pQVar2 = QVar1;
    }
    break;
  case WriteProperty:
    if (_id == 0) {
      pQVar2 = (QSize *)*_a;
      goto LAB_0014fe61;
    }
    break;
  case IndexOfMethod:
    if ((*_a[1] == iconSizeChanged) && (*(long *)((long)_a[1] + 8) == 0)) {
      *(undefined4 *)*_a = 0;
    }
  }
  return;
}

Assistant:

void QtMWidgets::ToolButton::qt_static_metacall(QObject *_o, QMetaObject::Call _c, int _id, void **_a)
{
    if (_c == QMetaObject::InvokeMetaMethod) {
        auto *_t = static_cast<ToolButton *>(_o);
        (void)_t;
        switch (_id) {
        case 0: _t->iconSizeChanged((*reinterpret_cast< std::add_pointer_t<QSize>>(_a[1]))); break;
        case 1: _t->setIconSize((*reinterpret_cast< std::add_pointer_t<QSize>>(_a[1]))); break;
        default: ;
        }
    } else if (_c == QMetaObject::IndexOfMethod) {
        int *result = reinterpret_cast<int *>(_a[0]);
        {
            using _t = void (ToolButton::*)(const QSize & );
            if (*reinterpret_cast<_t *>(_a[1]) == static_cast<_t>(&ToolButton::iconSizeChanged)) {
                *result = 0;
                return;
            }
        }
    }
#ifndef QT_NO_PROPERTIES
    else if (_c == QMetaObject::ReadProperty) {
        auto *_t = static_cast<ToolButton *>(_o);
        (void)_t;
        void *_v = _a[0];
        switch (_id) {
        case 0: *reinterpret_cast< QSize*>(_v) = _t->iconSize(); break;
        default: break;
        }
    } else if (_c == QMetaObject::WriteProperty) {
        auto *_t = static_cast<ToolButton *>(_o);
        (void)_t;
        void *_v = _a[0];
        switch (_id) {
        case 0: _t->setIconSize(*reinterpret_cast< QSize*>(_v)); break;
        default: break;
        }
    } else if (_c == QMetaObject::ResetProperty) {
    } else if (_c == QMetaObject::BindableProperty) {
    }
#endif // QT_NO_PROPERTIES
}